

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__encode_uint8_srgb_BGRA(void *outputp,int width_times_channels,float *encode)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  char *pcVar4;
  float fVar5;
  undefined1 (*pauVar6) [16];
  undefined1 (*pauVar7) [16];
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [16];
  undefined1 (*pauVar10) [16];
  undefined1 (*pauVar11) [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 (*pauVar16) [16];
  char cVar17;
  char *pcVar18;
  char *pcVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  short sVar36;
  short sVar41;
  short sVar42;
  short sVar43;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  short sVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  
  auVar15 = _DAT_001c4020;
  auVar14 = _DAT_001c4010;
  auVar13 = _DAT_001c4000;
  auVar12 = _DAT_001c3ff0;
  pcVar4 = (char *)((long)outputp + (long)width_times_channels);
  if (width_times_channels < 0x10) {
    if (3 < width_times_channels) {
      pcVar18 = (char *)((long)outputp + 4);
      do {
        fVar5 = encode[2];
        if (fVar5 <= 0.00012207031) {
          cVar17 = '\0';
        }
        else {
          cVar17 = -1;
          if (fVar5 <= 0.99999994) {
            cVar17 = (char)(((uint)fVar5 >> 0xc & 0xff) *
                            (fp32_to_srgb8_tab4[(int)fVar5 + 0xc7000000U >> 0x14] & 0xffff) +
                            (fp32_to_srgb8_tab4[(int)fVar5 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00)
                           >> 0x10);
          }
        }
        pcVar18[-4] = cVar17;
        fVar5 = encode[1];
        if (fVar5 <= 0.00012207031) {
          cVar17 = '\0';
        }
        else {
          cVar17 = -1;
          if (fVar5 <= 0.99999994) {
            cVar17 = (char)(((uint)fVar5 >> 0xc & 0xff) *
                            (fp32_to_srgb8_tab4[(int)fVar5 + 0xc7000000U >> 0x14] & 0xffff) +
                            (fp32_to_srgb8_tab4[(int)fVar5 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00)
                           >> 0x10);
          }
        }
        pcVar18[-3] = cVar17;
        fVar5 = *encode;
        if (fVar5 <= 0.00012207031) {
          cVar17 = '\0';
        }
        else {
          cVar17 = -1;
          if (fVar5 <= 0.99999994) {
            cVar17 = (char)(((uint)fVar5 >> 0xc & 0xff) *
                            (fp32_to_srgb8_tab4[(int)fVar5 + 0xc7000000U >> 0x14] & 0xffff) +
                            (fp32_to_srgb8_tab4[(int)fVar5 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00)
                           >> 0x10);
          }
        }
        pcVar18[-2] = cVar17;
        fVar5 = encode[3];
        if (fVar5 <= 0.00012207031) {
          cVar17 = '\0';
        }
        else {
          cVar17 = -1;
          if (fVar5 <= 0.99999994) {
            cVar17 = (char)(((uint)fVar5 >> 0xc & 0xff) *
                            (fp32_to_srgb8_tab4[(int)fVar5 + 0xc7000000U >> 0x14] & 0xffff) +
                            (fp32_to_srgb8_tab4[(int)fVar5 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00)
                           >> 0x10);
          }
        }
        pcVar18[-1] = cVar17;
        encode = encode + 4;
        pcVar18 = pcVar18 + 4;
      } while (pcVar18 <= pcVar4);
    }
  }
  else {
    pauVar16 = (undefined1 (*) [16])(encode + (long)width_times_channels + -0x10);
    do {
      pcVar18 = (char *)((long)outputp + 0x10);
      pcVar19 = pcVar4 + -0x10;
      if (pcVar18 == pcVar4) {
        pcVar19 = pcVar18;
      }
      pauVar1 = (undefined1 (*) [16])((long)encode + 0x40);
      auVar25 = *(undefined1 (*) [16])encode;
      pauVar2 = (undefined1 (*) [16])((long)encode + 0x10);
      pauVar6 = (undefined1 (*) [16])((long)encode + 0x10);
      pauVar7 = (undefined1 (*) [16])((long)encode + 0x10);
      pauVar8 = (undefined1 (*) [16])((long)encode + 0x10);
      auVar28 = *(undefined1 (*) [16])((long)encode + 0x20);
      pauVar3 = (undefined1 (*) [16])((long)encode + 0x30);
      pauVar9 = (undefined1 (*) [16])((long)encode + 0x30);
      pauVar10 = (undefined1 (*) [16])((long)encode + 0x30);
      pauVar11 = (undefined1 (*) [16])((long)encode + 0x30);
      encode = (float *)pauVar16;
      if (pcVar18 == pcVar4) {
        encode = (float *)pauVar1;
      }
      if (pcVar18 <= pcVar4 + -0x10) {
        encode = (float *)pauVar1;
        pcVar19 = pcVar18;
      }
      auVar52._8_4_ = auVar25._4_4_;
      auVar52._0_8_ = auVar25._0_8_;
      auVar52._12_4_ = *(undefined4 *)(*pauVar6 + 4);
      auVar47._4_4_ = *(undefined4 *)*pauVar2;
      auVar47._0_4_ = auVar25._0_4_;
      auVar45._8_4_ = auVar28._4_4_;
      auVar45._0_8_ = auVar28._0_8_;
      auVar45._12_4_ = *(undefined4 *)(*pauVar9 + 4);
      auVar46._8_8_ = auVar45._8_8_;
      auVar47._12_4_ = *(undefined4 *)*pauVar3;
      auVar47._8_4_ = auVar28._0_4_;
      auVar50._0_8_ = CONCAT44(*(undefined4 *)(*pauVar7 + 8),auVar25._8_4_);
      auVar50._8_4_ = auVar25._12_4_;
      auVar50._12_4_ = *(undefined4 *)(*pauVar8 + 0xc);
      auVar25._0_8_ = CONCAT44(*(undefined4 *)(*pauVar10 + 8),auVar28._8_4_);
      auVar25._8_4_ = auVar28._12_4_;
      auVar25._12_4_ = *(undefined4 *)(*pauVar11 + 0xc);
      auVar46._0_8_ = auVar52._8_8_;
      auVar37._8_8_ = auVar25._0_8_;
      auVar37._0_8_ = auVar50._0_8_;
      auVar28._8_8_ = auVar25._8_8_;
      auVar28._0_8_ = auVar50._8_8_;
      auVar25 = maxps(auVar47,auVar12);
      auVar26 = minps(auVar25,auVar13);
      auVar25 = maxps(auVar46,auVar12);
      auVar47 = minps(auVar25,auVar13);
      auVar25 = maxps(auVar37,auVar12);
      auVar38 = minps(auVar25,auVar13);
      auVar25 = maxps(auVar28,auVar12);
      auVar25 = minps(auVar25,auVar13);
      auVar51._12_4_ =
           *(undefined4 *)
            (
            "St23_Sp_counted_ptr_inplaceINSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS4_6filterIZNS4_3cpu19deconv2x2_avx_floatIfLi8ELi1EEEvRKNS4_5ImageERS9_PKfEUliiPKvPvE_JSA_S9_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS9_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSL_EUliE_EEvSQ_SQ_OT0_EUliE_iEESaIiEFvvEEES10_LN9__gnu_cxx12_Lock_policyE2EE"
            + (ulong)(auVar26._12_4_ >> 0x14) * 4 + 0x76);
      auVar51._8_4_ =
           *(undefined4 *)
            (
            "St23_Sp_counted_ptr_inplaceINSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS4_6filterIZNS4_3cpu19deconv2x2_avx_floatIfLi8ELi1EEEvRKNS4_5ImageERS9_PKfEUliiPKvPvE_JSA_S9_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS9_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSL_EUliE_EEvSQ_SQ_OT0_EUliE_iEESaIiEFvvEEES10_LN9__gnu_cxx12_Lock_policyE2EE"
            + (ulong)(auVar26._8_4_ >> 0x14) * 4 + 0x76);
      auVar51._4_4_ =
           *(undefined4 *)
            (
            "St23_Sp_counted_ptr_inplaceINSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS4_6filterIZNS4_3cpu19deconv2x2_avx_floatIfLi8ELi1EEEvRKNS4_5ImageERS9_PKfEUliiPKvPvE_JSA_S9_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS9_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSL_EUliE_EEvSQ_SQ_OT0_EUliE_iEESaIiEFvvEEES10_LN9__gnu_cxx12_Lock_policyE2EE"
            + (ulong)(auVar26._4_4_ >> 0x14) * 4 + 0x76);
      auVar51._0_4_ =
           *(undefined4 *)
            (
            "St23_Sp_counted_ptr_inplaceINSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS4_6filterIZNS4_3cpu19deconv2x2_avx_floatIfLi8ELi1EEEvRKNS4_5ImageERS9_PKfEUliiPKvPvE_JSA_S9_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS9_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSL_EUliE_EEvSQ_SQ_OT0_EUliE_iEESaIiEFvvEEES10_LN9__gnu_cxx12_Lock_policyE2EE"
            + (ulong)(auVar26._0_4_ >> 0x14) * 4 + 0x76);
      auVar54._12_4_ =
           *(undefined4 *)
            (
            "St23_Sp_counted_ptr_inplaceINSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS4_6filterIZNS4_3cpu19deconv2x2_avx_floatIfLi8ELi1EEEvRKNS4_5ImageERS9_PKfEUliiPKvPvE_JSA_S9_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS9_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSL_EUliE_EEvSQ_SQ_OT0_EUliE_iEESaIiEFvvEEES10_LN9__gnu_cxx12_Lock_policyE2EE"
            + (ulong)(auVar47._12_4_ >> 0x14) * 4 + 0x76);
      auVar54._8_4_ =
           *(undefined4 *)
            (
            "St23_Sp_counted_ptr_inplaceINSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS4_6filterIZNS4_3cpu19deconv2x2_avx_floatIfLi8ELi1EEEvRKNS4_5ImageERS9_PKfEUliiPKvPvE_JSA_S9_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS9_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSL_EUliE_EEvSQ_SQ_OT0_EUliE_iEESaIiEFvvEEES10_LN9__gnu_cxx12_Lock_policyE2EE"
            + (ulong)(auVar47._8_4_ >> 0x14) * 4 + 0x76);
      auVar54._4_4_ =
           *(undefined4 *)
            (
            "St23_Sp_counted_ptr_inplaceINSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS4_6filterIZNS4_3cpu19deconv2x2_avx_floatIfLi8ELi1EEEvRKNS4_5ImageERS9_PKfEUliiPKvPvE_JSA_S9_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS9_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSL_EUliE_EEvSQ_SQ_OT0_EUliE_iEESaIiEFvvEEES10_LN9__gnu_cxx12_Lock_policyE2EE"
            + (ulong)(auVar47._4_4_ >> 0x14) * 4 + 0x76);
      auVar54._0_4_ =
           *(undefined4 *)
            (
            "St23_Sp_counted_ptr_inplaceINSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS4_6filterIZNS4_3cpu19deconv2x2_avx_floatIfLi8ELi1EEEvRKNS4_5ImageERS9_PKfEUliiPKvPvE_JSA_S9_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS9_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSL_EUliE_EEvSQ_SQ_OT0_EUliE_iEESaIiEFvvEEES10_LN9__gnu_cxx12_Lock_policyE2EE"
            + (ulong)(auVar47._0_4_ >> 0x14) * 4 + 0x76);
      auVar55._12_4_ =
           *(undefined4 *)
            (
            "St23_Sp_counted_ptr_inplaceINSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS4_6filterIZNS4_3cpu19deconv2x2_avx_floatIfLi8ELi1EEEvRKNS4_5ImageERS9_PKfEUliiPKvPvE_JSA_S9_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS9_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSL_EUliE_EEvSQ_SQ_OT0_EUliE_iEESaIiEFvvEEES10_LN9__gnu_cxx12_Lock_policyE2EE"
            + (ulong)(auVar38._12_4_ >> 0x14) * 4 + 0x76);
      auVar55._8_4_ =
           *(undefined4 *)
            (
            "St23_Sp_counted_ptr_inplaceINSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS4_6filterIZNS4_3cpu19deconv2x2_avx_floatIfLi8ELi1EEEvRKNS4_5ImageERS9_PKfEUliiPKvPvE_JSA_S9_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS9_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSL_EUliE_EEvSQ_SQ_OT0_EUliE_iEESaIiEFvvEEES10_LN9__gnu_cxx12_Lock_policyE2EE"
            + (ulong)(auVar38._8_4_ >> 0x14) * 4 + 0x76);
      auVar55._4_4_ =
           *(undefined4 *)
            (
            "St23_Sp_counted_ptr_inplaceINSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS4_6filterIZNS4_3cpu19deconv2x2_avx_floatIfLi8ELi1EEEvRKNS4_5ImageERS9_PKfEUliiPKvPvE_JSA_S9_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS9_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSL_EUliE_EEvSQ_SQ_OT0_EUliE_iEESaIiEFvvEEES10_LN9__gnu_cxx12_Lock_policyE2EE"
            + (ulong)(auVar38._4_4_ >> 0x14) * 4 + 0x76);
      auVar55._0_4_ =
           *(undefined4 *)
            (
            "St23_Sp_counted_ptr_inplaceINSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS4_6filterIZNS4_3cpu19deconv2x2_avx_floatIfLi8ELi1EEEvRKNS4_5ImageERS9_PKfEUliiPKvPvE_JSA_S9_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS9_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSL_EUliE_EEvSQ_SQ_OT0_EUliE_iEESaIiEFvvEEES10_LN9__gnu_cxx12_Lock_policyE2EE"
            + (ulong)(auVar38._0_4_ >> 0x14) * 4 + 0x76);
      auVar53._12_4_ =
           *(undefined4 *)
            (
            "St23_Sp_counted_ptr_inplaceINSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS4_6filterIZNS4_3cpu19deconv2x2_avx_floatIfLi8ELi1EEEvRKNS4_5ImageERS9_PKfEUliiPKvPvE_JSA_S9_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS9_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSL_EUliE_EEvSQ_SQ_OT0_EUliE_iEESaIiEFvvEEES10_LN9__gnu_cxx12_Lock_policyE2EE"
            + (ulong)(auVar25._12_4_ >> 0x14) * 4 + 0x76);
      auVar53._8_4_ =
           *(undefined4 *)
            (
            "St23_Sp_counted_ptr_inplaceINSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS4_6filterIZNS4_3cpu19deconv2x2_avx_floatIfLi8ELi1EEEvRKNS4_5ImageERS9_PKfEUliiPKvPvE_JSA_S9_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS9_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSL_EUliE_EEvSQ_SQ_OT0_EUliE_iEESaIiEFvvEEES10_LN9__gnu_cxx12_Lock_policyE2EE"
            + (ulong)(auVar25._8_4_ >> 0x14) * 4 + 0x76);
      auVar53._4_4_ =
           *(undefined4 *)
            (
            "St23_Sp_counted_ptr_inplaceINSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS4_6filterIZNS4_3cpu19deconv2x2_avx_floatIfLi8ELi1EEEvRKNS4_5ImageERS9_PKfEUliiPKvPvE_JSA_S9_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS9_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSL_EUliE_EEvSQ_SQ_OT0_EUliE_iEESaIiEFvvEEES10_LN9__gnu_cxx12_Lock_policyE2EE"
            + (ulong)(auVar25._4_4_ >> 0x14) * 4 + 0x76);
      auVar53._0_4_ =
           *(undefined4 *)
            (
            "St23_Sp_counted_ptr_inplaceINSt13__future_base11_Task_stateISt5_BindIFZN2ac4core11parallelForIiZNS4_6filterIZNS4_3cpu19deconv2x2_avx_floatIfLi8ELi1EEEvRKNS4_5ImageERS9_PKfEUliiPKvPvE_JSA_S9_ETnNSt9enable_ifIXfraasr3stdE9is_same_vIS9_NSt9remove_cvIT0_E4typeEEEbE4typeELb1EEEvOT_DpRSL_EUliE_EEvSQ_SQ_OT0_EUliE_iEESaIiEFvvEEES10_LN9__gnu_cxx12_Lock_policyE2EE"
            + (ulong)(auVar25._0_4_ >> 0x14) * 4 + 0x76);
      auVar27._0_4_ = auVar26._0_4_ >> 0xc;
      auVar27._4_4_ = auVar26._4_4_ >> 0xc;
      auVar27._8_4_ = auVar26._8_4_ >> 0xc;
      auVar27._12_4_ = auVar26._12_4_ >> 0xc;
      auVar28 = pmaddwd(auVar27 & auVar14 | auVar15,auVar51);
      auVar29._0_4_ = auVar28._0_4_ >> 0x10;
      auVar29._4_4_ = auVar28._4_4_ >> 0x10;
      auVar29._8_4_ = auVar28._8_4_ >> 0x10;
      auVar29._12_4_ = auVar28._12_4_ >> 0x10;
      auVar48._0_4_ = auVar47._0_4_ >> 0xc;
      auVar48._4_4_ = auVar47._4_4_ >> 0xc;
      auVar48._8_4_ = auVar47._8_4_ >> 0xc;
      auVar48._12_4_ = auVar47._12_4_ >> 0xc;
      auVar28 = pmaddwd(auVar48 & auVar14 | auVar15,auVar54);
      auVar49._0_4_ = auVar28._0_4_ >> 0x10;
      auVar49._4_4_ = auVar28._4_4_ >> 0x10;
      auVar49._8_4_ = auVar28._8_4_ >> 0x10;
      auVar49._12_4_ = auVar28._12_4_ >> 0x10;
      auVar39._0_4_ = auVar38._0_4_ >> 0xc;
      auVar39._4_4_ = auVar38._4_4_ >> 0xc;
      auVar39._8_4_ = auVar38._8_4_ >> 0xc;
      auVar39._12_4_ = auVar38._12_4_ >> 0xc;
      auVar28 = pmaddwd(auVar39 & auVar14 | auVar15,auVar55);
      auVar40._0_4_ = auVar28._0_4_ >> 0x10;
      auVar40._4_4_ = auVar28._4_4_ >> 0x10;
      auVar40._8_4_ = auVar28._8_4_ >> 0x10;
      auVar40._12_4_ = auVar28._12_4_ >> 0x10;
      auVar28 = packssdw(auVar40,auVar49);
      auVar26._0_4_ = auVar25._0_4_ >> 0xc;
      auVar26._4_4_ = auVar25._4_4_ >> 0xc;
      auVar26._8_4_ = auVar25._8_4_ >> 0xc;
      auVar26._12_4_ = auVar25._12_4_ >> 0xc;
      auVar25 = pmaddwd(auVar26 & auVar14 | auVar15,auVar53);
      auVar38._0_4_ = auVar25._0_4_ >> 0x10;
      auVar38._4_4_ = auVar25._4_4_ >> 0x10;
      auVar38._8_4_ = auVar25._8_4_ >> 0x10;
      auVar38._12_4_ = auVar25._12_4_ >> 0x10;
      auVar25 = packssdw(auVar29,auVar38);
      sVar32 = auVar25._6_2_;
      sVar23 = auVar28._6_2_;
      sVar31 = auVar25._4_2_;
      sVar22 = auVar28._4_2_;
      sVar30 = auVar25._2_2_;
      sVar21 = auVar28._2_2_;
      sVar20 = auVar28._0_2_;
      sVar24 = auVar25._0_2_;
      sVar41 = auVar28._8_2_;
      sVar33 = auVar25._8_2_;
      sVar42 = auVar28._10_2_;
      sVar34 = auVar25._10_2_;
      sVar43 = auVar28._12_2_;
      sVar35 = auVar25._12_2_;
      sVar44 = auVar28._14_2_;
      sVar36 = auVar25._14_2_;
      *(char *)outputp = (0 < sVar20) * (sVar20 < 0x100) * auVar28[0] - (0xff < sVar20);
      *(char *)((long)outputp + 1) = (0 < sVar41) * (sVar41 < 0x100) * auVar28[8] - (0xff < sVar41);
      *(char *)((long)outputp + 2) = (0 < sVar24) * (sVar24 < 0x100) * auVar25[0] - (0xff < sVar24);
      *(char *)((long)outputp + 3) = (0 < sVar33) * (sVar33 < 0x100) * auVar25[8] - (0xff < sVar33);
      *(char *)((long)outputp + 4) = (0 < sVar21) * (sVar21 < 0x100) * auVar28[2] - (0xff < sVar21);
      *(char *)((long)outputp + 5) = (0 < sVar42) * (sVar42 < 0x100) * auVar28[10] - (0xff < sVar42)
      ;
      *(char *)((long)outputp + 6) = (0 < sVar30) * (sVar30 < 0x100) * auVar25[2] - (0xff < sVar30);
      *(char *)((long)outputp + 7) = (0 < sVar34) * (sVar34 < 0x100) * auVar25[10] - (0xff < sVar34)
      ;
      *(char *)((long)outputp + 8) = (0 < sVar22) * (sVar22 < 0x100) * auVar28[4] - (0xff < sVar22);
      *(char *)((long)outputp + 9) =
           (0 < sVar43) * (sVar43 < 0x100) * auVar28[0xc] - (0xff < sVar43);
      *(char *)((long)outputp + 10) = (0 < sVar31) * (sVar31 < 0x100) * auVar25[4] - (0xff < sVar31)
      ;
      *(char *)((long)outputp + 0xb) =
           (0 < sVar35) * (sVar35 < 0x100) * auVar25[0xc] - (0xff < sVar35);
      *(char *)((long)outputp + 0xc) =
           (0 < sVar23) * (sVar23 < 0x100) * auVar28[6] - (0xff < sVar23);
      *(char *)((long)outputp + 0xd) =
           (0 < sVar44) * (sVar44 < 0x100) * auVar28[0xe] - (0xff < sVar44);
      *(char *)((long)outputp + 0xe) =
           (0 < sVar32) * (sVar32 < 0x100) * auVar25[6] - (0xff < sVar32);
      *(char *)((long)outputp + 0xf) =
           (0 < sVar36) * (sVar36 < 0x100) * auVar25[0xe] - (0xff < sVar36);
      outputp = pcVar19;
    } while (pcVar18 != pcVar4);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_srgb )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char*) outputp;
  unsigned char * end_output = ( (unsigned char*) output ) + width_times_channels;

  #ifdef STBIR_SIMD

  if ( width_times_channels >= 16 )
  {
    float const * end_encode_m16 = encode + width_times_channels - 16;
    end_output -= 16;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdf f0, f1, f2, f3;
      stbir__simdi i0, i1, i2, i3;
      STBIR_SIMD_NO_UNROLL(encode);

      stbir__simdf_load4_transposed( f0, f1, f2, f3, encode );

      stbir__min_max_shift20( i0, f0 );
      stbir__min_max_shift20( i1, f1 );
      stbir__min_max_shift20( i2, f2 );
      stbir__min_max_shift20( i3, f3 );

      stbir__simdi_table_lookup4( i0, i1, i2, i3, ( fp32_to_srgb8_tab4 - (127-13)*8 ) );

      stbir__linear_to_srgb_finish( i0, f0 );
      stbir__linear_to_srgb_finish( i1, f1 );
      stbir__linear_to_srgb_finish( i2, f2 );
      stbir__linear_to_srgb_finish( i3, f3 );

      stbir__interleave_pack_and_store_16_u8( output,  STBIR_strs_join1(i, ,stbir__encode_order0), STBIR_strs_join1(i, ,stbir__encode_order1), STBIR_strs_join1(i, ,stbir__encode_order2), STBIR_strs_join1(i, ,stbir__encode_order3) );

      encode += 16;
      output += 16;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 16 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m16;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while ( output <= end_output )
  {
    STBIR_SIMD_NO_UNROLL(encode);

    output[0-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order0] );
    output[1-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order1] );
    output[2-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order2] );
    output[3-4] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order3] );

    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    STBIR_NO_UNROLL(encode);
    output[0] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order0] );
    #if stbir__coder_min_num >= 2
    output[1] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order1] );
    #endif
    #if stbir__coder_min_num >= 3
    output[2] = stbir__linear_to_srgb_uchar( encode[stbir__encode_order2] );
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}